

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_align_search.c
# Opt level: O0

void evaluate_hmms(phone_loop_search_t *pls,int16 *senscr,int frame_idx)

{
  int32 iVar1;
  int32 score;
  hmm_t *hmm;
  int local_20;
  int i;
  int32 bs;
  int frame_idx_local;
  int16 *senscr_local;
  phone_loop_search_t *pls_local;
  
  local_20 = -0x20000000;
  pls->hmmctx->senscore = senscr;
  for (hmm._4_4_ = 0; hmm._4_4_ < pls->n_phones; hmm._4_4_ = hmm._4_4_ + 1) {
    if ((frame_idx <= pls->hmms[hmm._4_4_].frame) &&
       (iVar1 = hmm_vit_eval(pls->hmms + hmm._4_4_), local_20 < iVar1)) {
      local_20 = iVar1;
    }
  }
  pls->best_score = local_20;
  return;
}

Assistant:

static int32
evaluate_hmms(state_align_search_t *sas, int16 const *senscr, int frame_idx)
{
    int32 bs = WORST_SCORE;
    int i;

    hmm_context_set_senscore(sas->hmmctx, senscr);

    for (i = 0; i < sas->n_phones; ++i) {
        hmm_t *hmm = sas->hmms + i;
        int32 score;

        if (hmm_frame(hmm) < frame_idx)
            continue;
        score = hmm_vit_eval(hmm);
        if (score BETTER_THAN bs) {
            bs = score;
        }
    }
    return bs;
}